

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_sessionwidget.cpp
# Opt level: O2

void SessionWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int searchId;
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  QMetaTypeInterface *pQVar6;
  RegExpReplacement *this;
  QArrayDataPointer<std::pair<QString,_QString>_> *this_00;
  undefined1 local_3b0 [24];
  undefined1 local_398 [24];
  QArrayDataPointer<QString> local_380;
  undefined1 local_368 [24];
  QArrayDataPointer<std::pair<QString,_QString>_> local_350;
  ReplacedParams local_338;
  RegExpReplacement local_318;
  RegExpReplacement local_2f8;
  RegExpPath local_2d8;
  ReplaceParams local_2a0;
  RegExp local_268;
  SearchNameHits local_220;
  CountFilesParams local_1c0;
  SearchHits local_168;
  SearchParams local_e0;
  
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<SearchParams>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    default:
      puVar5 = (undefined8 *)*_a;
      break;
    case 3:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<ReplaceParams>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    case 4:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<CountFilesParams>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    case 6:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<GetListingParams>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    case 7:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<RenameParams>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    case 8:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<ViewOptions>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    case 0x12:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<SearchHits>::metaType;
      }
      else {
        if (*_a[1] != 2) break;
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<SearchNameHits>::metaType;
      }
LAB_0011f6ef:
      *puVar5 = pQVar6;
      return;
    case 0x17:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<RegExp>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    case 0x18:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<RegExpPath>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    case 0x19:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<RegExpReplacement>::metaType;
        goto LAB_0011f6ef;
      }
      break;
    case 0x1a:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<ReplacedParams>::metaType;
        goto LAB_0011f6ef;
      }
    }
    *puVar5 = 0;
    return;
  }
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == search && lVar3 == 0) {
      *puVar1 = 0;
      return;
    }
    if (pcVar2 == searchMore && lVar3 == 0) {
      *puVar1 = 1;
      return;
    }
    if (pcVar2 == collect && lVar3 == 0) {
      *puVar1 = 2;
      return;
    }
    if (pcVar2 == replace && lVar3 == 0) {
      *puVar1 = 3;
      return;
    }
    if (pcVar2 == countFiles && lVar3 == 0) {
      *puVar1 = 4;
      return;
    }
    if (pcVar2 == canReplace && lVar3 == 0) {
      *puVar1 = 5;
      return;
    }
    if (pcVar2 == getListing && lVar3 == 0) {
      *puVar1 = 6;
      return;
    }
    if (pcVar2 == rename && lVar3 == 0) {
      *puVar1 = 7;
      return;
    }
    if (pcVar2 != viewOptionsChanged || lVar3 != 0) {
      return;
    }
    *puVar1 = 8;
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    SearchParams::SearchParams(&local_e0,(SearchParams *)_a[1]);
    search((SessionWidget *)_o,&local_e0);
    SearchParams::~SearchParams(&local_e0);
    break;
  case 1:
    searchMore((SessionWidget *)_o,*_a[1]);
    return;
  case 2:
    collect((SessionWidget *)_o);
    return;
  case 3:
    ReplaceParams::ReplaceParams(&local_2a0,(ReplaceParams *)_a[1]);
    replace((SessionWidget *)_o,&local_2a0);
    ReplaceParams::~ReplaceParams(&local_2a0);
    break;
  case 4:
    CountFilesParams::CountFilesParams(&local_1c0,(CountFilesParams *)_a[1]);
    countFiles((SessionWidget *)_o,&local_1c0);
    CountFilesParams::~CountFilesParams(&local_1c0);
    break;
  case 5:
    canReplace((SessionWidget *)_o,*_a[1]);
    return;
  case 6:
    GetListingParams::GetListingParams((GetListingParams *)&local_2f8,(GetListingParams *)_a[1]);
    getListing((SessionWidget *)_o,(GetListingParams *)&local_2f8);
    this = &local_2f8;
    goto LAB_0011f682;
  case 7:
    plVar4 = (long *)_a[1];
    local_350.d = (Data *)*plVar4;
    local_350.ptr = (pair<QString,_QString> *)plVar4[1];
    local_350.size = plVar4[2];
    if (local_350.d != (Data *)0x0) {
      LOCK();
      ((local_350.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_350.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    rename((SessionWidget *)_o,(char *)&local_350,(char *)local_350.ptr);
    this_00 = &local_350;
    goto LAB_0011f6ca;
  case 8:
    viewOptionsChanged((SessionWidget *)_o,*(ViewOptions *)_a[1]);
    return;
  case 9:
    onCanceled((SessionWidget *)_o);
    return;
  case 10:
    onCountFiles((SessionWidget *)_o);
    return;
  case 0xb:
    onGetListing((SessionWidget *)_o);
    return;
  case 0xc:
    onFilesCounted((SessionWidget *)_o);
    return;
  case 0xd:
    onRenamed((SessionWidget *)_o,*_a[1],*_a[2]);
    return;
  case 0xe:
    onTabClose((SessionWidget *)_o,*_a[1]);
    return;
  case 0xf:
    onCompleterActivated((SessionWidget *)_o,*(QModelIndex *)_a[1]);
    break;
  case 0x10:
    plVar4 = (long *)_a[1];
    local_368._0_8_ = *plVar4;
    local_368._8_8_ = plVar4[1];
    local_368._16_8_ = plVar4[2];
    if ((Data *)local_368._0_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_368._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_368._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    plVar4 = (long *)_a[2];
    local_380.d = (Data *)*plVar4;
    local_380.ptr = (QString *)plVar4[1];
    local_380.size = plVar4[2];
    if (local_380.d != (Data *)0x0) {
      LOCK();
      ((local_380.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_380.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    onListing((SessionWidget *)_o,(QString *)local_368,(QStringList *)&local_380);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_380);
    this = (RegExpReplacement *)local_368;
    goto LAB_0011f682;
  case 0x11:
    on_results_currentChanged((SessionWidget *)_o,*_a[1]);
    return;
  case 0x12:
    searchId = *_a[1];
    SearchHits::SearchHits(&local_168,(SearchHits *)_a[2]);
    SearchNameHits::SearchNameHits(&local_220,(SearchNameHits *)_a[3]);
    onFound((SessionWidget *)_o,searchId,&local_168,&local_220);
    SearchNameHits::~SearchNameHits(&local_220);
    SearchHits::~SearchHits(&local_168);
    break;
  case 0x13:
    onSearch((SessionWidget *)_o);
    return;
  case 0x14:
    plVar4 = (long *)_a[1];
    local_398._0_8_ = *plVar4;
    local_398._8_8_ = plVar4[1];
    local_398._16_8_ = plVar4[2];
    if ((Data *)local_398._0_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_398._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_398._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    onPathChanged((SessionWidget *)_o,(QString *)local_398);
    this = (RegExpReplacement *)local_398;
    goto LAB_0011f682;
  case 0x15:
    onPreview((SessionWidget *)_o);
    return;
  case 0x16:
    onReplace((SessionWidget *)_o);
    return;
  case 0x17:
    RegExp::RegExp(&local_268,(RegExp *)_a[1]);
    onPatternChanged((SessionWidget *)_o,&local_268);
    RegExp::~RegExp(&local_268);
    break;
  case 0x18:
    RegExpPath::RegExpPath(&local_2d8,(RegExpPath *)_a[1]);
    onFilterChanged((SessionWidget *)_o,&local_2d8);
    RegExpPath::~RegExpPath(&local_2d8);
    break;
  case 0x19:
    RegExpReplacement::RegExpReplacement(&local_318,(RegExpReplacement *)_a[1]);
    onReplacementChanged((SessionWidget *)_o,&local_318);
    this = &local_318;
    goto LAB_0011f682;
  case 0x1a:
    ReplacedParams::ReplacedParams(&local_338,(ReplacedParams *)_a[1]);
    onReplaced((SessionWidget *)_o,&local_338);
    this_00 = &local_338.mRenames.d;
LAB_0011f6ca:
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(this_00);
    break;
  case 0x1b:
    onCancel((SessionWidget *)_o);
    return;
  case 0x1c:
    plVar4 = (long *)_a[1];
    local_3b0._0_8_ = *plVar4;
    local_3b0._8_8_ = plVar4[1];
    local_3b0._16_8_ = plVar4[2];
    if ((Data *)local_3b0._0_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_3b0._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_3b0._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    on_open_textChanged((SessionWidget *)_o,(QString *)local_3b0);
    this = (RegExpReplacement *)local_3b0;
LAB_0011f682:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
    break;
  case 0x1d:
    onCacheFileListClicked((SessionWidget *)_o,*_a[1]);
    return;
  }
  return;
}

Assistant:

void SessionWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<SessionWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->search((*reinterpret_cast< std::add_pointer_t<SearchParams>>(_a[1]))); break;
        case 1: _t->searchMore((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->collect(); break;
        case 3: _t->replace((*reinterpret_cast< std::add_pointer_t<ReplaceParams>>(_a[1]))); break;
        case 4: _t->countFiles((*reinterpret_cast< std::add_pointer_t<CountFilesParams>>(_a[1]))); break;
        case 5: _t->canReplace((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->getListing((*reinterpret_cast< std::add_pointer_t<GetListingParams>>(_a[1]))); break;
        case 7: _t->rename((*reinterpret_cast< std::add_pointer_t<RenameParams>>(_a[1]))); break;
        case 8: _t->viewOptionsChanged((*reinterpret_cast< std::add_pointer_t<ViewOptions>>(_a[1]))); break;
        case 9: _t->onCanceled(); break;
        case 10: _t->onCountFiles(); break;
        case 11: _t->onGetListing(); break;
        case 12: _t->onFilesCounted(); break;
        case 13: _t->onRenamed((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 14: _t->onTabClose((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 15: _t->onCompleterActivated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 16: _t->onListing((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 17: _t->on_results_currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 18: _t->onFound((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<SearchHits>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<SearchNameHits>>(_a[3]))); break;
        case 19: _t->onSearch(); break;
        case 20: _t->onPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 21: _t->onPreview(); break;
        case 22: _t->onReplace(); break;
        case 23: _t->onPatternChanged((*reinterpret_cast< std::add_pointer_t<RegExp>>(_a[1]))); break;
        case 24: _t->onFilterChanged((*reinterpret_cast< std::add_pointer_t<RegExpPath>>(_a[1]))); break;
        case 25: _t->onReplacementChanged((*reinterpret_cast< std::add_pointer_t<RegExpReplacement>>(_a[1]))); break;
        case 26: _t->onReplaced((*reinterpret_cast< std::add_pointer_t<ReplacedParams>>(_a[1]))); break;
        case 27: _t->onCancel(); break;
        case 28: _t->on_open_textChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->onCacheFileListClicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchParams >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ReplaceParams >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< CountFilesParams >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< GetListingParams >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RenameParams >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ViewOptions >(); break;
            }
            break;
        case 18:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchHits >(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchNameHits >(); break;
            }
            break;
        case 23:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExp >(); break;
            }
            break;
        case 24:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExpPath >(); break;
            }
            break;
        case 25:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExpReplacement >(); break;
            }
            break;
        case 26:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ReplacedParams >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (SessionWidget::*)(SearchParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::search)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::searchMore)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::collect)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(ReplaceParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::replace)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(CountFilesParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::countFiles)) {
                *result = 4;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::canReplace)) {
                *result = 5;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(GetListingParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::getListing)) {
                *result = 6;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(RenameParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::rename)) {
                *result = 7;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(ViewOptions );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::viewOptionsChanged)) {
                *result = 8;
                return;
            }
        }
    }
}